

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsort_wrapper.hpp
# Opt level: O0

void dss::construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long>
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      end,vector<unsigned_long,_std::allocator<unsigned_long>_> *SA)

{
  size_type __new_size;
  size_type sVar1;
  reference pcVar2;
  reference pvVar3;
  size_t n;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *SA_local;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  end_local;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  begin_local;
  
  end_local = begin;
  __new_size = std::distance<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(begin,end);
  sVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(SA);
  if (sVar1 != __new_size) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(SA,__new_size);
  }
  pcVar2 = __gnu_cxx::
           __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator*(&end_local);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](SA,0);
  divsufsort64(pcVar2,pvVar3,__new_size);
  return;
}

Assistant:

void construct(InputIterator begin, InputIterator end, std::vector<T>& SA)
{
    typedef typename std::iterator_traits<InputIterator>::value_type char_t;
    if (sizeof(char_t) != 1)
        throw std::runtime_error("Input must be a char type");
    std::size_t n = std::distance(begin, end);
    if (SA.size() != n)
        SA.resize(n);
    if (sizeof(T) == sizeof(saidx_t)) {
        if (n >= std::numeric_limits<saidx_t>::max())
            throw std::runtime_error("Input size is too large for 32bit indexing.");
        divsufsort(reinterpret_cast<const sauchar_t*>(&(*begin)), reinterpret_cast<saidx_t*>(&SA[0]), n);
    } else if (sizeof(T) == sizeof(saidx64_t)) {
        divsufsort64(reinterpret_cast<const sauchar_t*>(&(*begin)), reinterpret_cast<saidx64_t*>(&SA[0]), n);
    } else {
        throw std::runtime_error("Unsupported datatype of Suffix Array.");
    }
}